

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O1

void __thiscall MSX::Speaker<false>::Speaker(Speaker<false> *this)

{
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue);
  GI::AY38910::AY38910SampleSource<false>::AY38910SampleSource
            (&(this->ay).super_AY38910SampleSource<false>,AY38910,&this->audio_queue);
  (this->ay).super_SampleSource<GI::AY38910::AY38910<false>,_false,_4>.master_divider_ = 0;
  Audio::Toggle::Toggle(&this->audio_toggle,&this->audio_queue);
  Konami::SCC::SCC(&this->scc,&this->audio_queue);
  Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>::
  CompoundSource(&this->mixer,&this->ay,&this->audio_toggle,&this->scc);
  Outputs::Speaker::
  PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>_>
  ::PullLowpass(&this->speaker,&this->mixer);
  return;
}

Assistant:

Speaker() :
		ay(GI::AY38910::Personality::AY38910, audio_queue),
		audio_toggle(audio_queue),
		scc(audio_queue),
		mixer(ay, audio_toggle, scc),
		speaker(mixer) {}